

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void write_character_dump(ang_file *fff)

{
  byte bVar1;
  store_conflict *psVar2;
  _Bool _Var3;
  char cVar4;
  uint16_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  object *poVar10;
  angband_constants *paVar11;
  size_t sVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  char *pcVar19;
  wchar_t wVar20;
  wchar_t c;
  char *local_b0;
  wchar_t a;
  object **local_a0;
  store_conflict *local_98;
  store_conflict *local_90;
  char o_name [80];
  
  psVar2 = stores;
  bVar1 = f_info[0xe].shopnum;
  local_a0 = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  _Var3 = have_valid_char_sheet_config();
  if (!_Var3) {
    configure_char_sheet();
  }
  local_90 = psVar2 + bVar1;
  local_98 = psVar2 + ((ulong)bVar1 - 1);
  iVar9 = 0x50;
  if (L'\'' < cached_config->res_cols) {
    iVar9 = cached_config->res_cols * 2 + 1;
  }
  wVar6 = text_wcsz();
  local_b0 = (char *)mem_alloc((long)(wVar6 * iVar9 + 1));
  file_putf(fff,"  [%s Character Dump]\n\n",buildid);
  display_player(L'\0');
  for (wVar6 = L'\x01'; wVar6 != L'\x17'; wVar6 = wVar6 + L'\x01') {
    pcVar19 = local_b0;
    for (wVar20 = L'\0'; wVar20 != L'O'; wVar20 = wVar20 + L'\x01') {
      Term_what(wVar20,wVar6,&a,&c);
      wVar7 = text_wctomb(pcVar19,c);
      if (wVar7 < L'\x01') {
        *pcVar19 = ' ';
        pcVar19 = pcVar19 + 1;
      }
      else {
        pcVar19 = pcVar19 + (uint)wVar7;
      }
    }
    do {
      pcVar13 = pcVar19;
      if (pcVar13 <= local_b0) break;
      pcVar19 = pcVar13 + -1;
    } while (pcVar13[-1] == ' ');
    *pcVar13 = '\0';
    file_putf(fff,"%s\n",local_b0);
  }
  display_player(L'\x01');
  file_putf(fff,"%-20s%s\n","Resistances","Abilities");
  iVar9 = cached_config->res_regions[0].row;
  wVar6 = cached_config->n_resist_by_region[1];
  if (cached_config->n_resist_by_region[1] < cached_config->n_resist_by_region[0]) {
    wVar6 = cached_config->n_resist_by_region[0];
  }
  for (wVar20 = iVar9 + L'\x02'; wVar20 < iVar9 + wVar6 + L'\x02'; wVar20 = wVar20 + L'\x01') {
    pcVar19 = local_b0;
    for (wVar7 = L'\0'; wVar7 <= cached_config->res_cols * 2; wVar7 = wVar7 + L'\x01') {
      Term_what(wVar7,wVar20,&a,&c);
      wVar8 = text_wctomb(pcVar19,c);
      if (wVar8 < L'\x01') {
        *pcVar19 = ' ';
        pcVar19 = pcVar19 + 1;
      }
      else {
        pcVar19 = pcVar19 + (uint)wVar8;
      }
    }
    do {
      pcVar13 = pcVar19;
      if (pcVar13 <= local_b0) break;
      pcVar19 = pcVar13 + -1;
    } while (pcVar13[-1] == ' ');
    *pcVar13 = '\0';
    file_putf(fff,"%s\n",local_b0);
  }
  file_putf(fff,"\n");
  file_putf(fff,"%-20s%s\n","Hindrances","Modifiers");
  iVar9 = cached_config->res_regions[0].row;
  wVar6 = cached_config->n_resist_by_region[3];
  if (cached_config->n_resist_by_region[3] < cached_config->n_resist_by_region[2]) {
    wVar6 = cached_config->n_resist_by_region[2];
  }
  for (wVar20 = iVar9 + L'\x02'; wVar20 < iVar9 + wVar6 + L'\x02'; wVar20 = wVar20 + L'\x01') {
    pcVar19 = local_b0;
    for (iVar18 = 0; iVar16 = cached_config->res_cols * 2, iVar18 <= iVar16; iVar18 = iVar18 + 1) {
      Term_what(iVar18 + iVar16 + L'\x02',wVar20,&a,&c);
      wVar7 = text_wctomb(pcVar19,c);
      if (wVar7 < L'\x01') {
        *pcVar19 = ' ';
        pcVar19 = pcVar19 + 1;
      }
      else {
        pcVar19 = pcVar19 + (uint)wVar7;
      }
    }
    do {
      pcVar13 = pcVar19;
      if (pcVar13 <= local_b0) break;
      pcVar19 = pcVar13 + -1;
    } while (pcVar13[-1] == ' ');
    *pcVar13 = '\0';
    file_putf(fff,"%s\n",local_b0);
  }
  file_putf(fff,"\n\n");
  if (player->is_dead == true) {
    uVar5 = messages_num();
    uVar14 = 0xf;
    if (uVar5 < 0xf) {
      uVar14 = (uint)uVar5;
    }
    file_putf(fff,"  [Last Messages]\n\n");
    while (0 < (int)uVar14) {
      uVar14 = uVar14 - 1;
      pcVar19 = message_str((uint16_t)uVar14);
      file_putf(fff,"> %s\n",pcVar19);
    }
    pcVar19 = player->died_from;
    iVar9 = strcmp(pcVar19,"Retiring");
    if (iVar9 == 0) {
      file_putf(fff,"\nRetired.\n\n");
    }
    else {
      file_putf(fff,"\nKilled by %s.\n\n",pcVar19);
    }
  }
  file_putf(fff,"  [Character Equipment]\n\n");
  for (wVar6 = L'\0'; (uint)wVar6 < (uint)(player->body).count; wVar6 = wVar6 + L'\x01') {
    poVar10 = slot_object(player,wVar6);
    if (poVar10 != (object *)0x0) {
      object_desc(o_name,0x50,poVar10,0x43,player);
      cVar4 = gear_to_label(player,poVar10);
      file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar4,o_name);
      object_info_chardump(fff,poVar10,L'\x05',L'H');
    }
  }
  file_putf(fff,"\n\n");
  file_putf(fff,"\n\n  [Character Inventory]\n\n");
  for (uVar15 = 0; uVar15 < z_info->pack_size; uVar15 = uVar15 + 1) {
    poVar10 = player->upkeep->inven[uVar15];
    if (poVar10 == (object *)0x0) break;
    object_desc(o_name,0x50,poVar10,0x43,player);
    cVar4 = gear_to_label(player,poVar10);
    file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar4,o_name);
    object_info_chardump(fff,poVar10,L'\x05',L'H');
  }
  file_putf(fff,"\n\n");
  file_putf(fff,"\n\n  [Character Quiver]\n\n");
  paVar11 = z_info;
  for (uVar15 = 0; uVar15 < paVar11->quiver_size; uVar15 = uVar15 + 1) {
    poVar10 = player->upkeep->quiver[uVar15];
    if (poVar10 != (object *)0x0) {
      object_desc(o_name,0x50,poVar10,0x43,player);
      cVar4 = gear_to_label(player,poVar10);
      file_putf(fff,"%c) %s\n",(ulong)(uint)(int)cVar4,o_name);
      object_info_chardump(fff,poVar10,L'\x05',L'H');
      paVar11 = z_info;
    }
  }
  file_putf(fff,"\n\n");
  store_stock_list(local_98,local_a0,(uint)z_info->store_inven_max);
  if (local_90[-1].stock_num != '\0') {
    file_putf(fff,"  [Home Inventory]\n\n");
    for (uVar15 = 0;
        (uVar15 < z_info->store_inven_max && (poVar10 = local_a0[uVar15], poVar10 != (object *)0x0))
        ; uVar15 = uVar15 + 1) {
      object_desc(o_name,0x50,poVar10,0x43,player);
      file_putf(fff,"%c) %s\n",(ulong)((int)uVar15 + 0x61),o_name);
      object_info_chardump(fff,poVar10,L'\x05',L'H');
    }
    file_putf(fff,"\n\n");
  }
  dump_history(fff);
  file_putf(fff,"\n\n");
  file_putf(fff,"  [Options]\n\n");
  iVar9 = 0;
  do {
    pcVar19 = "User interface";
    if (iVar9 == 0) {
LAB_001d7c01:
      file_putf(fff,"  [%s]\n\n",pcVar19);
      for (lVar17 = 0; lVar17 != 0x2d; lVar17 = lVar17 + 1) {
        iVar16 = (int)lVar17;
        iVar18 = option_type(iVar16);
        if (iVar18 == iVar9) {
          pcVar19 = option_desc(iVar16);
          sVar12 = utf8_strlen(pcVar19);
          if (sVar12 < 0x2d) {
            file_putf(fff,"%s%*s",pcVar19,(ulong)(0x2d - (int)sVar12)," ");
          }
          else {
            file_putf(fff,"%s",pcVar19);
          }
          pcVar19 = "no ";
          if ((player->opts).opt[lVar17] != false) {
            pcVar19 = "yes";
          }
          pcVar13 = option_name(iVar16);
          file_putf(fff,": %s (%s)\n",pcVar19,pcVar13);
        }
      }
      file_putf(fff,"\n");
    }
    else {
      if (iVar9 == 1) {
        pcVar19 = "Birth";
        goto LAB_001d7c01;
      }
      if (iVar9 == 5) {
        if ((player->opts).opt[0x1e] == true) {
          file_putf(fff,"  [Randart seed]\n\n","User interface");
          file_putf(fff,"%08lx\n\n",(ulong)seed_randart);
        }
        mem_free(local_a0);
        mem_free(local_b0);
        return;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void write_character_dump(ang_file *fff)
{
	int i, x, y, ylim;

	int a;
	wchar_t c;

	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object **home_list = mem_zalloc(sizeof(struct object *) *
										   z_info->store_inven_max);
	char o_name[80];

	int n;
	char *buf, *p;

	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	n = 80;
	if (n < 2 * cached_config->res_cols + 1) {
		n = 2 * cached_config->res_cols + 1;
	}
	buf = mem_alloc(text_wcsz() * n + 1);

	/* Begin dump */
	file_putf(fff, "  [%s Character Dump]\n\n", buildid);

	/* Display player basics */
	display_player(0);

	/* Dump part of the screen */
	for (y = 1; y < 23; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 79; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Display player resistances etc */
	display_player(1);

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Resistances", "Abilities");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[0] >
		cached_config->n_resist_by_region[1]) ?
		cached_config->n_resist_by_region[0] :
		cached_config->n_resist_by_region[1]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip a line */
	file_putf(fff, "\n");

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Hindrances", "Modifiers");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[2] >
		cached_config->n_resist_by_region[3]) ?
		cached_config->n_resist_by_region[2] :
		cached_config->n_resist_by_region[3]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x + 2 * cached_config->res_cols + 2, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip some lines */
	file_putf(fff, "\n\n");


	/* If dead, dump last messages -- Prfnoff */
	if (player->is_dead) {
		i = messages_num();
		if (i > 15) i = 15;
		file_putf(fff, "  [Last Messages]\n\n");
		while (i-- > 0)
		{
			file_putf(fff, "> %s\n", message_str((int16_t)i));
		}
		if (streq(player->died_from, "Retiring")) {
			file_putf(fff, "\nRetired.\n\n");
		} else {
			file_putf(fff, "\nKilled by %s.\n\n",
				player->died_from);
		}
	}


	/* Dump the equipment */
	file_putf(fff, "  [Character Equipment]\n\n");
	for (i = 0; i < player->body.count; i++) {
		struct object *obj = slot_object(player, i);
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the inventory */
	file_putf(fff, "\n\n  [Character Inventory]\n\n");
	for (i = 0; i < z_info->pack_size; i++) {
		struct object *obj = player->upkeep->inven[i];
		if (!obj) break;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the quiver */
	file_putf(fff, "\n\n  [Character Quiver]\n\n");
	for (i = 0; i < z_info->quiver_size; i++) {
		struct object *obj = player->upkeep->quiver[i];
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the Home -- if anything there */
	store_stock_list(home, home_list, z_info->store_inven_max);
	if (home->stock_num) {
		/* Header */
		file_putf(fff, "  [Home Inventory]\n\n");

		/* Dump all available items */
		for (i = 0; i < z_info->store_inven_max; i++) {
			struct object *obj = home_list[i];
			if (!obj) break;
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
			file_putf(fff, "%c) %s\n", I2A(i), o_name);

			object_info_chardump(fff, obj, 5, 72);
		}

		/* Add an empty line */
		file_putf(fff, "\n\n");
	}

	/* Dump character history */
	dump_history(fff);
	file_putf(fff, "\n\n");

	/* Dump options */
	file_putf(fff, "  [Options]\n\n");

	/* Dump options */
	for (i = 0; i < OP_MAX; i++) {
		int opt;
		const char *title = "";
		switch (i) {
			case OP_INTERFACE: title = "User interface"; break;
			case OP_BIRTH: title = "Birth"; break;
		    default: continue;
		}

		file_putf(fff, "  [%s]\n\n", title);
		for (opt = 0; opt < OPT_MAX; opt++) {
			const char *desc;
			size_t u8len;

			if (option_type(opt) != i) continue;
			desc = option_desc(opt);
			u8len = utf8_strlen(desc);
			if (u8len < 45) {
				file_putf(fff, "%s%*s", desc,
					(int)(45 - u8len), " ");
			} else {
				file_putf(fff, "%s", desc);
			}
			file_putf(fff, ": %s (%s)\n",
			        player->opts.opt[opt] ? "yes" : "no ",
			        option_name(opt));
		}

		/* Skip some lines */
		file_putf(fff, "\n");
	}

	/*
	 * Display the randart seed, if applicable.  Use the same format as is
	 * used when constructing the randart file name.
	 */
	if (OPT(player, birth_randarts)) {
		file_putf(fff, "  [Randart seed]\n\n");
		file_putf(fff, "%08lx\n\n", (unsigned long)seed_randart);
	}

	mem_free(home_list);
	mem_free(buf);
}